

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,PortalImageInfiniteLight *p,Transform *args,
          Image *args_1,RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  Float scale;
  RGBColorSpace *imageColorSpace;
  undefined1 auVar1 [16];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_160;
  Image local_148;
  
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_148.format = args_1->format;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_148.channelNames,&args_1->channelNames);
  local_148.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(args_1->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  local_148.p8.alloc.memoryResource = (args_1->p8).alloc.memoryResource;
  local_148.p8.nAlloc = (args_1->p8).nAlloc;
  local_148.p8.nStored = (args_1->p8).nStored;
  auVar1 = ZEXT816(0) << 0x20;
  local_148.p8.ptr = (args_1->p8).ptr;
  (args_1->p8).nStored = 0;
  (args_1->p8).ptr = (uchar *)auVar1._0_8_;
  (args_1->p8).nAlloc = auVar1._8_8_;
  local_148.p16.alloc.memoryResource = (args_1->p16).alloc.memoryResource;
  local_148.p16.nAlloc = (args_1->p16).nAlloc;
  local_148.p16.nStored = (args_1->p16).nStored;
  local_148.p16.ptr = (args_1->p16).ptr;
  (args_1->p16).nStored = 0;
  (args_1->p16).ptr = (Half *)auVar1._0_8_;
  (args_1->p16).nAlloc = auVar1._8_8_;
  local_148.p32.alloc.memoryResource = (args_1->p32).alloc.memoryResource;
  local_148.p32.nAlloc = (args_1->p32).nAlloc;
  local_148.p32.nStored = (args_1->p32).nStored;
  local_148.p32.ptr = (args_1->p32).ptr;
  (args_1->p32).nStored = 0;
  (args_1->p32).ptr = (float *)auVar1._0_8_;
  (args_1->p32).nAlloc = auVar1._8_8_;
  scale = *args_3;
  imageColorSpace = *args_2;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector(&local_160,args_5)
  ;
  pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
            (p,args,&local_148,imageColorSpace,scale,args_4,&local_160,args_6->memoryResource);
  if (local_160.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }